

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_nextInputType_e ZSTD_nextInputType(ZSTD_DCtx *dctx)

{
  long in_RDI;
  ZSTD_nextInputType_e local_4;
  
  switch(*(undefined4 *)(in_RDI + 0x752c)) {
  case 0:
  case 1:
    local_4 = ZSTDnit_frameHeader;
    break;
  case 2:
    local_4 = ZSTDnit_blockHeader;
    break;
  case 3:
    local_4 = ZSTDnit_block;
    break;
  case 4:
    local_4 = ZSTDnit_lastBlock;
    break;
  case 5:
    local_4 = ZSTDnit_checksum;
    break;
  case 6:
  case 7:
    local_4 = ZSTDnit_skippableFrame;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa012,"ZSTD_nextInputType_e ZSTD_nextInputType(ZSTD_DCtx *)");
  }
  return local_4;
}

Assistant:

ZSTD_nextInputType_e ZSTD_nextInputType(ZSTD_DCtx* dctx) {
    switch(dctx->stage)
    {
    default:   /* should not happen */
        assert(0);
        ZSTD_FALLTHROUGH;
    case ZSTDds_getFrameHeaderSize:
        ZSTD_FALLTHROUGH;
    case ZSTDds_decodeFrameHeader:
        return ZSTDnit_frameHeader;
    case ZSTDds_decodeBlockHeader:
        return ZSTDnit_blockHeader;
    case ZSTDds_decompressBlock:
        return ZSTDnit_block;
    case ZSTDds_decompressLastBlock:
        return ZSTDnit_lastBlock;
    case ZSTDds_checkChecksum:
        return ZSTDnit_checksum;
    case ZSTDds_decodeSkippableHeader:
        ZSTD_FALLTHROUGH;
    case ZSTDds_skipFrame:
        return ZSTDnit_skippableFrame;
    }
}